

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

void __thiscall Nibbler::getRemainder(Nibbler *this,string *result)

{
  string local_38 [32];
  string *local_18;
  string *result_local;
  Nibbler *this_local;
  
  if (this->_cursor < this->_length) {
    local_18 = result;
    result_local = &this->_input;
    std::__cxx11::string::substr((ulong)local_38,(ulong)this);
    std::__cxx11::string::operator=((string *)local_18,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Nibbler::getRemainder (std::string& result)
{
  if (_cursor < _length)
    result = _input.substr (_cursor);
}